

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rematch.cpp
# Opt level: O2

int32_t __thiscall
icu_63::RegexMatcher::split
          (RegexMatcher *this,UText *input,UText **dest,int32_t destCapacity,UErrorCode *status)

{
  UBool UVar1;
  int32_t iVar2;
  uint uVar3;
  int64_t iVar4;
  UChar *pUVar5;
  int64_t limit;
  char16_t *pcVar6;
  UText *pUVar7;
  UText *pUVar8;
  undefined4 in_register_0000000c;
  long limit_00;
  int iVar9;
  ulong uVar10;
  int iVar11;
  int iVar12;
  int64_t local_118;
  UErrorCode lengthStatus;
  ulong local_108;
  ulong local_100;
  UText **local_f8;
  UText *local_f0;
  long local_e8;
  undefined8 local_e0;
  UText *local_d8;
  ulong local_d0;
  long local_c8;
  UText remainingText;
  
  local_e0 = CONCAT44(in_register_0000000c,destCapacity);
  iVar2 = 0;
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    iVar2 = 0;
    if (destCapacity < 1) {
      *status = U_ILLEGAL_ARGUMENT_ERROR;
    }
    else {
      reset(this,input);
      limit_00 = this->fActiveLimit;
      if (limit_00 != 0) {
        local_e8 = CONCAT44(local_e8._4_4_,this->fPattern->fGroupMap->count);
        local_108 = (ulong)((int)local_e0 - 1);
        local_c8 = (long)((int)local_e0 + -2);
        uVar10 = 0;
        local_118 = 0;
        local_f8 = dest;
        local_f0 = input;
        while( true ) {
          pUVar8 = local_f0;
          iVar9 = (int)uVar10;
          iVar12 = (int)local_108;
          iVar11 = (int)local_118;
          if (iVar12 <= iVar9) break;
          UVar1 = find(this);
          if (UVar1 == '\0') {
            if (((pUVar8->chunkNativeStart == 0) && (this->fInputLength == pUVar8->chunkNativeLimit)
                ) && (this->fInputLength == (long)pUVar8->nativeIndexingLimit)) {
              pUVar7 = dest[iVar9];
              if (pUVar7 == (UText *)0x0) {
                memset(&remainingText,0,0x90);
                remainingText.magic = 0x345ad82c;
                remainingText.sizeOfStruct = 0x90;
                utext_openUChars_63(&remainingText,pUVar8->chunkContents + local_118,
                                    this->fActiveLimit - local_118,status);
                pUVar8 = utext_clone_63((UText *)0x0,&remainingText,'\x01','\0',status);
                dest[iVar9] = pUVar8;
                utext_close_63(&remainingText);
              }
              else {
                iVar4 = utext_nativeLength_63(pUVar7);
                utext_replace_63(pUVar7,0,iVar4,pUVar8->chunkContents + local_118,
                                 (int)this->fActiveLimit - iVar11,status);
              }
            }
            else {
              lengthStatus = U_ZERO_ERROR;
              iVar2 = utext_extract_63(pUVar8,local_118,this->fActiveLimit,(UChar *)0x0,0,
                                       &lengthStatus);
              local_e8 = (long)iVar2;
              pUVar5 = (UChar *)uprv_malloc_63(local_e8 * 2 + 2);
              if (pUVar5 != (UChar *)0x0) {
                utext_extract_63(pUVar8,local_118,this->fActiveLimit,pUVar5,iVar2 + 1,status);
                pUVar8 = dest[iVar9];
                local_100 = uVar10;
                if (pUVar8 == (UText *)0x0) {
                  memset(&remainingText,0,0x90);
                  remainingText.magic = 0x345ad82c;
                  remainingText.sizeOfStruct = 0x90;
                  utext_openUChars_63(&remainingText,pUVar5,local_e8,status);
                  pUVar8 = utext_clone_63((UText *)0x0,&remainingText,'\x01','\0',status);
                  dest[iVar9] = pUVar8;
                  utext_close_63(&remainingText);
                }
                else {
                  iVar4 = utext_nativeLength_63(pUVar8);
                  utext_replace_63(pUVar8,0,iVar4,pUVar5,iVar2,status);
                }
                uprv_free_63(pUVar5);
                iVar12 = (int)local_100;
                goto LAB_00167fcd;
              }
LAB_00167fc0:
              *status = U_MEMORY_ALLOCATION_ERROR;
            }
LAB_00167fca:
            iVar12 = (int)uVar10;
            goto LAB_00167fcd;
          }
          if (((pUVar8->chunkNativeStart == 0) && (this->fInputLength == pUVar8->chunkNativeLimit))
             && (this->fInputLength == (long)pUVar8->nativeIndexingLimit)) {
            pUVar7 = dest[iVar9];
            if (pUVar7 == (UText *)0x0) {
              memset(&remainingText,0,0x90);
              remainingText.magic = 0x345ad82c;
              remainingText.sizeOfStruct = 0x90;
              utext_openUChars_63(&remainingText,pUVar8->chunkContents + local_118,
                                  this->fMatchStart - local_118,status);
              pUVar8 = utext_clone_63((UText *)0x0,&remainingText,'\x01','\0',status);
              dest[iVar9] = pUVar8;
              utext_close_63(&remainingText);
            }
            else {
              iVar4 = utext_nativeLength_63(pUVar7);
              utext_replace_63(pUVar7,0,iVar4,pUVar8->chunkContents + local_118,
                               (int)this->fMatchStart - iVar11,status);
            }
          }
          else {
            lengthStatus = U_ZERO_ERROR;
            iVar2 = utext_extract_63(pUVar8,local_118,this->fMatchStart,(UChar *)0x0,0,&lengthStatus
                                    );
            local_100 = (ulong)iVar2;
            pUVar5 = (UChar *)uprv_malloc_63(local_100 * 2 + 2);
            if (pUVar5 == (UChar *)0x0) goto LAB_00167fc0;
            utext_extract_63(pUVar8,local_118,this->fMatchStart,pUVar5,iVar2 + 1,status);
            pUVar8 = dest[iVar9];
            if (pUVar8 == (UText *)0x0) {
              memset(&remainingText,0,0x90);
              remainingText.magic = 0x345ad82c;
              remainingText.sizeOfStruct = 0x90;
              utext_openUChars_63(&remainingText,pUVar5,local_100,status);
              pUVar8 = utext_clone_63((UText *)0x0,&remainingText,'\x01','\0',status);
              dest[iVar9] = pUVar8;
              utext_close_63(&remainingText);
            }
            else {
              iVar4 = utext_nativeLength_63(pUVar8);
              utext_replace_63(pUVar8,0,iVar4,pUVar5,iVar2,status);
            }
            uprv_free_63(pUVar5);
          }
          local_118 = this->fMatchEnd;
          iVar12 = 1;
          uVar10 = (ulong)iVar9;
          while ((iVar12 <= (int)local_e8 && ((long)uVar10 < local_c8))) {
            pUVar8 = this->fInputText;
            pUVar7 = dest[uVar10 + 1];
            local_100 = uVar10;
            iVar4 = start64(this,iVar12,status);
            limit = end64(this,iVar12,status);
            dest = local_f8;
            if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
              local_d8 = pUVar8;
              if (iVar4 == limit) {
                if (pUVar7 == (UText *)0x0) {
                  pUVar7 = utext_openUChars_63((UText *)0x0,(UChar *)0x0,0,status);
                }
                else {
                  iVar4 = utext_nativeLength_63(pUVar7);
                  utext_replace_63(pUVar7,0,iVar4,(UChar *)0x0,0,status);
                }
              }
              else {
                uVar3 = utext_extract_63(pUVar8,iVar4,limit,(UChar *)0x0,0,status);
                dest = local_f8;
                if (*status == U_BUFFER_OVERFLOW_ERROR || *status < U_ILLEGAL_ARGUMENT_ERROR) {
                  *status = U_ZERO_ERROR;
                  remainingText._0_8_ = (long)&remainingText.sizeOfStruct + 2;
                  remainingText.providerProperties = 0x28;
                  remainingText.sizeOfStruct = remainingText.sizeOfStruct & 0xffffff00;
                  iVar11 = uVar3 + 1;
                  local_d0 = (ulong)uVar3;
                  if ((0x27 < (int)uVar3) &&
                     (pcVar6 = MaybeStackArray<char16_t,_40>::resize
                                         ((MaybeStackArray<char16_t,_40> *)&remainingText,iVar11,0),
                     pcVar6 == (char16_t *)0x0)) {
                    *status = U_MEMORY_ALLOCATION_ERROR;
                  }
                  utext_extract_63(local_d8,iVar4,limit,(UChar *)remainingText._0_8_,iVar11,status);
                  dest = local_f8;
                  iVar9 = (int)local_d0;
                  if (pUVar7 == (UText *)0x0) {
                    if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
                      lengthStatus = U_ZERO_ERROR;
                      pcVar6 = MaybeStackArray<char16_t,_40>::orphanOrClone
                                         ((MaybeStackArray<char16_t,_40> *)&remainingText,iVar11,
                                          &lengthStatus);
                      if (pcVar6 == (char16_t *)0x0) {
                        *status = U_MEMORY_ALLOCATION_ERROR;
                      }
                      else {
                        pUVar7 = utext_openUChars_63((UText *)0x0,pcVar6,(long)iVar9,status);
                        if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
                          *(byte *)&pUVar7->providerProperties =
                               (byte)pUVar7->providerProperties | 0x20;
                          goto LAB_00167cc9;
                        }
                        uprv_free_63(pcVar6);
                      }
                    }
                    pUVar7 = (UText *)0x0;
                  }
                  else {
                    iVar4 = utext_nativeLength_63(pUVar7);
                    utext_replace_63(pUVar7,0,iVar4,(UChar *)remainingText._0_8_,iVar9,status);
                  }
LAB_00167cc9:
                  MaybeStackArray<char16_t,_40>::~MaybeStackArray
                            ((MaybeStackArray<char16_t,_40> *)&remainingText);
                }
              }
            }
            dest[local_100 + 1] = pUVar7;
            iVar12 = iVar12 + 1;
            uVar10 = local_100 + 1;
          }
          limit_00 = this->fActiveLimit;
          if (local_118 == limit_00) {
            iVar12 = (int)uVar10 + 1;
            if ((int)local_e0 <= iVar12) goto LAB_00167fca;
            pUVar8 = dest[iVar12];
            if (pUVar8 == (UText *)0x0) {
              pUVar8 = utext_openUChars_63((UText *)0x0,(UChar *)0x0,0,status);
              dest[iVar12] = pUVar8;
            }
            else {
              iVar4 = utext_nativeLength_63(pUVar8);
              utext_replace_63(pUVar8,0,iVar4,L"",0,status);
            }
            goto LAB_00167fcd;
          }
          if (U_ZERO_ERROR < *status) goto LAB_00167fca;
          uVar10 = (ulong)((int)uVar10 + 1);
        }
        if (limit_00 - local_118 != 0 && local_118 <= limit_00) {
          if (((local_f0->chunkNativeStart == 0) &&
              (this->fInputLength == local_f0->chunkNativeLimit)) &&
             (this->fInputLength == (long)local_f0->nativeIndexingLimit)) {
            uVar10 = local_108 & 0xffffffff;
            pUVar8 = dest[uVar10];
            if (pUVar8 == (UText *)0x0) {
              memset(&remainingText,0,0x90);
              remainingText.magic = 0x345ad82c;
              remainingText.sizeOfStruct = 0x90;
              utext_openUChars_63(&remainingText,local_f0->chunkContents + local_118,
                                  limit_00 - local_118,status);
              pUVar8 = utext_clone_63((UText *)0x0,&remainingText,'\x01','\0',status);
              dest[uVar10] = pUVar8;
              utext_close_63(&remainingText);
            }
            else {
              iVar4 = utext_nativeLength_63(pUVar8);
              utext_replace_63(pUVar8,0,iVar4,local_f0->chunkContents + local_118,
                               (int)this->fActiveLimit - iVar11,status);
            }
          }
          else {
            lengthStatus = U_ZERO_ERROR;
            iVar2 = utext_extract_63(local_f0,local_118,limit_00,(UChar *)0x0,0,&lengthStatus);
            pUVar5 = (UChar *)uprv_malloc_63((long)iVar2 * 2 + 2);
            if (pUVar5 == (UChar *)0x0) {
              *status = U_MEMORY_ALLOCATION_ERROR;
            }
            else {
              utext_extract_63(pUVar8,local_118,this->fActiveLimit,pUVar5,iVar2 + 1,status);
              uVar10 = local_108 & 0xffffffff;
              pUVar8 = dest[uVar10];
              if (pUVar8 == (UText *)0x0) {
                memset(&remainingText,0,0x90);
                remainingText.magic = 0x345ad82c;
                remainingText.sizeOfStruct = 0x90;
                utext_openUChars_63(&remainingText,pUVar5,(long)iVar2,status);
                pUVar8 = utext_clone_63((UText *)0x0,&remainingText,'\x01','\0',status);
                dest[uVar10] = pUVar8;
                utext_close_63(&remainingText);
              }
              else {
                iVar4 = utext_nativeLength_63(pUVar8);
                utext_replace_63(pUVar8,0,iVar4,pUVar5,iVar2,status);
              }
              uprv_free_63(pUVar5);
            }
          }
          iVar12 = (int)local_108;
        }
LAB_00167fcd:
        iVar2 = iVar12 + 1;
      }
    }
  }
  return iVar2;
}

Assistant:

int32_t  RegexMatcher::split(UText *input,
        UText           *dest[],
        int32_t          destCapacity,
        UErrorCode      &status)
{
    //
    // Check arguements for validity
    //
    if (U_FAILURE(status)) {
        return 0;
    };

    if (destCapacity < 1) {
        status = U_ILLEGAL_ARGUMENT_ERROR;
        return 0;
    }

    //
    // Reset for the input text
    //
    reset(input);
    int64_t   nextOutputStringStart = 0;
    if (fActiveLimit == 0) {
        return 0;
    }

    //
    // Loop through the input text, searching for the delimiter pattern
    //
    int32_t i;
    int32_t numCaptureGroups = fPattern->fGroupMap->size();
    for (i=0; ; i++) {
        if (i>=destCapacity-1) {
            // There is one or zero output string left.
            // Fill the last output string with whatever is left from the input, then exit the loop.
            //  ( i will be == destCapacity if we filled the output array while processing
            //    capture groups of the delimiter expression, in which case we will discard the
            //    last capture group saved in favor of the unprocessed remainder of the
            //    input string.)
            i = destCapacity-1;
            if (fActiveLimit > nextOutputStringStart) {
                if (UTEXT_FULL_TEXT_IN_CHUNK(input, fInputLength)) {
                    if (dest[i]) {
                        utext_replace(dest[i], 0, utext_nativeLength(dest[i]),
                                      input->chunkContents+nextOutputStringStart,
                                      (int32_t)(fActiveLimit-nextOutputStringStart), &status);
                    } else {
                        UText remainingText = UTEXT_INITIALIZER;
                        utext_openUChars(&remainingText, input->chunkContents+nextOutputStringStart,
                                         fActiveLimit-nextOutputStringStart, &status);
                        dest[i] = utext_clone(NULL, &remainingText, TRUE, FALSE, &status);
                        utext_close(&remainingText);
                    }
                } else {
                    UErrorCode lengthStatus = U_ZERO_ERROR;
                    int32_t remaining16Length =
                        utext_extract(input, nextOutputStringStart, fActiveLimit, NULL, 0, &lengthStatus);
                    UChar *remainingChars = (UChar *)uprv_malloc(sizeof(UChar)*(remaining16Length+1));
                    if (remainingChars == NULL) {
                        status = U_MEMORY_ALLOCATION_ERROR;
                        break;
                    }

                    utext_extract(input, nextOutputStringStart, fActiveLimit, remainingChars, remaining16Length+1, &status);
                    if (dest[i]) {
                        utext_replace(dest[i], 0, utext_nativeLength(dest[i]), remainingChars, remaining16Length, &status);
                    } else {
                        UText remainingText = UTEXT_INITIALIZER;
                        utext_openUChars(&remainingText, remainingChars, remaining16Length, &status);
                        dest[i] = utext_clone(NULL, &remainingText, TRUE, FALSE, &status);
                        utext_close(&remainingText);
                    }

                    uprv_free(remainingChars);
                }
            }
            break;
        }
        if (find()) {
            // We found another delimiter.  Move everything from where we started looking
            //  up until the start of the delimiter into the next output string.
            if (UTEXT_FULL_TEXT_IN_CHUNK(input, fInputLength)) {
                if (dest[i]) {
                    utext_replace(dest[i], 0, utext_nativeLength(dest[i]),
                                  input->chunkContents+nextOutputStringStart,
                                  (int32_t)(fMatchStart-nextOutputStringStart), &status);
                } else {
                    UText remainingText = UTEXT_INITIALIZER;
                    utext_openUChars(&remainingText, input->chunkContents+nextOutputStringStart,
                                      fMatchStart-nextOutputStringStart, &status);
                    dest[i] = utext_clone(NULL, &remainingText, TRUE, FALSE, &status);
                    utext_close(&remainingText);
                }
            } else {
                UErrorCode lengthStatus = U_ZERO_ERROR;
                int32_t remaining16Length = utext_extract(input, nextOutputStringStart, fMatchStart, NULL, 0, &lengthStatus);
                UChar *remainingChars = (UChar *)uprv_malloc(sizeof(UChar)*(remaining16Length+1));
                if (remainingChars == NULL) {
                    status = U_MEMORY_ALLOCATION_ERROR;
                    break;
                }
                utext_extract(input, nextOutputStringStart, fMatchStart, remainingChars, remaining16Length+1, &status);
                if (dest[i]) {
                    utext_replace(dest[i], 0, utext_nativeLength(dest[i]), remainingChars, remaining16Length, &status);
                } else {
                    UText remainingText = UTEXT_INITIALIZER;
                    utext_openUChars(&remainingText, remainingChars, remaining16Length, &status);
                    dest[i] = utext_clone(NULL, &remainingText, TRUE, FALSE, &status);
                    utext_close(&remainingText);
                }

                uprv_free(remainingChars);
            }
            nextOutputStringStart = fMatchEnd;

            // If the delimiter pattern has capturing parentheses, the captured
            //  text goes out into the next n destination strings.
            int32_t groupNum;
            for (groupNum=1; groupNum<=numCaptureGroups; groupNum++) {
                if (i >= destCapacity-2) {
                    // Never fill the last available output string with capture group text.
                    // It will filled with the last field, the remainder of the
                    //  unsplit input text.
                    break;
                }
                i++;
                dest[i] = utext_extract_replace(fInputText, dest[i],
                                               start64(groupNum, status), end64(groupNum, status), &status);
            }

            if (nextOutputStringStart == fActiveLimit) {
                // The delimiter was at the end of the string.  We're done, but first
                // we output one last empty string, for the empty field following
                //   the delimiter at the end of input.
                if (i+1 < destCapacity) {
                    ++i;
                    if (dest[i] == NULL) {
                        dest[i] = utext_openUChars(NULL, NULL, 0, &status);
                    } else {
                        static const UChar emptyString[] = {(UChar)0};
                        utext_replace(dest[i], 0, utext_nativeLength(dest[i]), emptyString, 0, &status);
                    }
                }
                break;

            }
        }
        else
        {
            // We ran off the end of the input while looking for the next delimiter.
            // All the remaining text goes into the current output string.
            if (UTEXT_FULL_TEXT_IN_CHUNK(input, fInputLength)) {
                if (dest[i]) {
                    utext_replace(dest[i], 0, utext_nativeLength(dest[i]),
                                  input->chunkContents+nextOutputStringStart,
                                  (int32_t)(fActiveLimit-nextOutputStringStart), &status);
                } else {
                    UText remainingText = UTEXT_INITIALIZER;
                    utext_openUChars(&remainingText, input->chunkContents+nextOutputStringStart,
                                     fActiveLimit-nextOutputStringStart, &status);
                    dest[i] = utext_clone(NULL, &remainingText, TRUE, FALSE, &status);
                    utext_close(&remainingText);
                }
            } else {
                UErrorCode lengthStatus = U_ZERO_ERROR;
                int32_t remaining16Length = utext_extract(input, nextOutputStringStart, fActiveLimit, NULL, 0, &lengthStatus);
                UChar *remainingChars = (UChar *)uprv_malloc(sizeof(UChar)*(remaining16Length+1));
                if (remainingChars == NULL) {
                    status = U_MEMORY_ALLOCATION_ERROR;
                    break;
                }

                utext_extract(input, nextOutputStringStart, fActiveLimit, remainingChars, remaining16Length+1, &status);
                if (dest[i]) {
                    utext_replace(dest[i], 0, utext_nativeLength(dest[i]), remainingChars, remaining16Length, &status);
                } else {
                    UText remainingText = UTEXT_INITIALIZER;
                    utext_openUChars(&remainingText, remainingChars, remaining16Length, &status);
                    dest[i] = utext_clone(NULL, &remainingText, TRUE, FALSE, &status);
                    utext_close(&remainingText);
                }

                uprv_free(remainingChars);
            }
            break;
        }
        if (U_FAILURE(status)) {
            break;
        }
    }   // end of for loop
    return i+1;
}